

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_NtkIsAcyclic(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  Abc_Ntk_t *pAVar2;
  FILE *__stream;
  int iVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  char *pcVar6;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  int iVar7;
  Abc_Obj_t *pNode;
  long lVar8;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar3 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar3 + 500;
    iVar7 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar7) {
      piVar4 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) goto LAB_001c6179;
      (pNtk->vTravIds).nCap = iVar7;
      in_RDX = extraout_RDX;
    }
    if (-500 < iVar3) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar7;
  }
  iVar3 = pNtk->nTravIds;
  pNtk->nTravIds = iVar3 + 1;
  if (iVar3 < 0x3fffffff) {
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar3 = pNtk->vObjs->nSize;
      uVar1 = (long)iVar3 + 500;
      iVar7 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar7) {
        piVar4 = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = piVar4;
        if (piVar4 == (int *)0x0) {
LAB_001c6179:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar7;
        in_RDX = extraout_RDX_01;
      }
      if (-500 < iVar3) {
        memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
        in_RDX = extraout_RDX_02;
      }
      (pNtk->vTravIds).nSize = iVar7;
    }
    iVar3 = pNtk->nTravIds;
    pNtk->nTravIds = iVar3 + 1;
    if (iVar3 < 0x3fffffff) {
      pVVar5 = pNtk->vCos;
      if (0 < pVVar5->nSize) {
        lVar8 = 0;
        do {
          pNode = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*pVVar5->pArray[lVar8] + 0x20) + 8) +
                   (long)**(int **)((long)pVVar5->pArray[lVar8] + 0x20) * 8);
          if (pNode->pNtk->ntkType == ABC_NTK_NETLIST) {
            pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
          }
          pAVar2 = pNode->pNtk;
          iVar3 = pNode->Id;
          Vec_IntFillExtra(&pAVar2->vTravIds,iVar3 + 1,(int)in_RDX);
          if (((long)iVar3 < 0) || ((pAVar2->vTravIds).nSize <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          in_RDX = extraout_RDX_03;
          if (((pAVar2->vTravIds).pArray[iVar3] != pNode->pNtk->nTravIds + -1) &&
             (iVar3 = Abc_NtkIsAcyclic_rec(pNode), __stream = _stdout, in_RDX = extraout_RDX_04,
             iVar3 == 0)) {
            pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray])
            ;
            fprintf(__stream," CO \"%s\"\n",pcVar6);
            return 0;
          }
          lVar8 = lVar8 + 1;
          pVVar5 = pNtk->vCos;
        } while (lVar8 < pVVar5->nSize);
      }
      return 1;
    }
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkIsAcyclic( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int fAcyclic;
    int i;
    // set the traversal ID for this DFS ordering
    Abc_NtkIncrementTravId( pNtk );   
    Abc_NtkIncrementTravId( pNtk );   
    // pNode->TravId == pNet->nTravIds      means "pNode is on the path"
    // pNode->TravId == pNet->nTravIds - 1  means "pNode is visited but is not on the path"
    // pNode->TravId <  pNet->nTravIds - 1  means "pNode is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
        if ( Abc_NodeIsTravIdPrevious(pNode) )
            continue;
        // traverse the output logic cone
        if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pNode)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, " CO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        break;
    }
    return fAcyclic;
}